

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.h
# Opt level: O0

void __thiscall CodeGenRegVmStateContext::CodeGenRegVmStateContext(CodeGenRegVmStateContext *this)

{
  CodeGenRegVmStateContext *this_local;
  
  this->ctx = (CodeGenRegVmContext *)0x0;
  this->callWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint *)0x0;
  this->checkedReturnWrap = (_func_void_CodeGenRegVmStateContext_ptr_uintptr_t_uint *)0x0;
  this->convertPtrWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint_uint *)0x0;
  this->errorOutOfBoundsWrap = (_func_void_CodeGenRegVmStateContext_ptr *)0x0;
  this->errorNoReturnWrap = (_func_void_CodeGenRegVmStateContext_ptr *)0x0;
  this->errorInvalidFunctionPointer = (_func_void_CodeGenRegVmStateContext_ptr *)0x0;
  this->dataStackBase = (char *)0x0;
  this->dataStackTop = (char *)0x0;
  this->dataStackEnd = (char *)0x0;
  this->callStackBase = (CodeGenRegVmCallStackEntry *)0x0;
  this->callStackTop = (CodeGenRegVmCallStackEntry *)0x0;
  this->callStackEnd = (CodeGenRegVmCallStackEntry *)0x0;
  this->regFileArrayBase = (RegVmRegister *)0x0;
  this->regFileLastPtr = (RegVmRegister *)0x0;
  this->regFileLastTop = (RegVmRegister *)0x0;
  this->regFileArrayEnd = (RegVmRegister *)0x0;
  this->tempStackType = 0;
  this->tempStackArrayBase = (uint *)0x0;
  this->tempStackArrayEnd = (uint *)0x0;
  this->callInstructionPos = 0;
  this->instAddress = (uchar **)0x0;
  this->functionAddress = (uchar **)0x0;
  this->exRegVmConstants = (uint *)0x0;
  this->codeLaunchHeader = (uchar *)0x0;
  this->x64PowWrap = (_func_int_int_int *)0x0;
  this->x64PowdWrap = (_func_double_double_double *)0x0;
  this->x64ModdWrap = (_func_double_double_double *)0x0;
  this->x64PowlWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86PowWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint_uint *)0x0;
  this->x86PowdWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint_uint *)0x0;
  this->x86ModdWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint_uint *)0x0;
  this->x86MullWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86DivlWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86PowlWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86ModlWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86LtodWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint *)0x0;
  this->x86DtolWrap = (_func_void_CodeGenRegVmStateContext_ptr_uint *)0x0;
  this->x86ShllWrap = (_func_longlong_longlong_longlong *)0x0;
  this->x86ShrlWrap = (_func_longlong_longlong_longlong *)0x0;
  this->vsAsmStyle = false;
  this->jitCodeActive = false;
  return;
}

Assistant:

CodeGenRegVmStateContext()
	{
		ctx = NULL;

		callWrap = NULL;
		checkedReturnWrap = NULL;
		convertPtrWrap = NULL;

		errorOutOfBoundsWrap = NULL;
		errorNoReturnWrap = NULL;
		errorInvalidFunctionPointer = NULL;

		dataStackBase = NULL;
		dataStackTop = NULL;
		dataStackEnd = NULL;

		callStackBase = NULL;
		callStackTop = NULL;
		callStackEnd = NULL;

		regFileArrayBase = NULL;
		regFileLastPtr = NULL;
		regFileLastTop = NULL;
		regFileArrayEnd = NULL;

		tempStackType = 0;
		tempStackArrayBase = NULL;
		tempStackArrayEnd = NULL;

		callInstructionPos = 0;

		instAddress = NULL;
		functionAddress = NULL;

		exRegVmConstants = NULL;

		codeLaunchHeader = NULL;

		x64PowWrap = NULL;
		x64PowdWrap = NULL;
		x64ModdWrap = NULL;
		x64PowlWrap = NULL;

		x86PowWrap = NULL;
		x86PowdWrap = NULL;
		x86ModdWrap = NULL;
		x86MullWrap = NULL;
		x86DivlWrap = NULL;
		x86PowlWrap = NULL;
		x86ModlWrap = NULL;
		x86LtodWrap = NULL;
		x86DtolWrap = NULL;
		x86ShllWrap = NULL;
		x86ShrlWrap = NULL;

		vsAsmStyle = false;

		jitCodeActive = false;
	}